

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initLinkerTool(VcprojGenerator *this)

{
  QString *this_00;
  QMakeProject *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  ProStringList *pPVar6;
  long lVar7;
  ProString *lib;
  ProString *this_01;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_b8 [2];
  QArrayDataPointer<char16_t> local_88;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_LFLAGS");
  pPVar6 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  VCToolBase::parseOptions(&(this->vcProject).Configuration.linker.super_VCToolBase,pPVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_68,"DEF_FILE");
  pPVar6 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  lVar7 = (pPVar6->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (lVar7 != 0) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_b8,"DEF_FILE");
    QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
    ProString::toQString((QString *)&local_88,&local_68);
    pDVar3 = (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.d;
    pcVar4 = (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.ptr;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.d = local_88.d;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.ptr = local_88.ptr;
    qVar2 = (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.size;
    (this->vcProject).Configuration.linker.ModuleDefinitionFile.d.size = local_88.size;
    local_88.d = pDVar3;
    local_88.ptr = pcVar4;
    local_88.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  }
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    local_b8[0].size = -0x5555555555555556;
    local_b8[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b8[0].ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)&local_68,initLinkerTool::lflags[lVar7]);
    MakefileGenerator::fixLibFlags
              ((ProStringList *)local_b8,(MakefileGenerator *)this,(ProKey *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    this_01 = local_b8[0].ptr;
    for (lVar8 = local_b8[0].size * 0x30; lVar8 != 0; lVar8 = lVar8 + -0x30) {
      bVar5 = ProString::startsWith(this_01,"/LIBPATH:",CaseSensitive);
      if (bVar5) {
        ProString::mid(&local_68,this_01,9,-1);
        ProString::toQString((QString *)&local_88,&local_68);
        QList<QString>::emplaceBack<QString>
                  (&(this->vcProject).Configuration.linker.AdditionalLibraryDirectories,
                   (QString *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      else {
        ProString::toQString(&local_68.m_string,this_01);
        QList<QString>::emplaceBack<QString>
                  (&(this->vcProject).Configuration.linker.AdditionalDependencies,&local_68.m_string
                  );
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      this_01 = this_01 + 1;
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(local_b8);
  }
  this_00 = &(this->vcProject).Configuration.linker.OutputFile;
  QString::operator=(this_00,"$(OutDir)\\");
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_b8,"MSVCPROJ_TARGET");
  QMakeEvaluator::first(&local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString((QString *)&local_88,&local_68);
  QString::append((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLinkerTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.linker.parseOptions(project->values("QMAKE_LFLAGS"));

    if (!project->values("DEF_FILE").isEmpty())
        conf.linker.ModuleDefinitionFile = project->first("DEF_FILE").toQString();

    static const char * const lflags[] = { "LIBS", "LIBS_PRIVATE",
                                           "QMAKE_LIBS", "QMAKE_LIBS_PRIVATE", nullptr };
    for (int i = 0; lflags[i]; i++) {
        const auto libs = fixLibFlags(lflags[i]);
        for (const ProString &lib : libs) {
            if (lib.startsWith("/LIBPATH:"))
                conf.linker.AdditionalLibraryDirectories << lib.mid(9).toQString();
            else
                conf.linker.AdditionalDependencies << lib.toQString();
        }
    }

    conf.linker.OutputFile = "$(OutDir)\\";
    conf.linker.OutputFile += project->first("MSVCPROJ_TARGET").toQString();
}